

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O3

int quicly_ranges_add(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  quicly_range_t *pqVar1;
  int iVar2;
  quicly_range_t *pqVar3;
  size_t slot;
  size_t end_slot;
  size_t sVar4;
  uint64_t *puVar5;
  bool bVar6;
  
  if (end < start) {
    __assert_fail("start <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                  ,0x65,"int quicly_ranges_add(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  if (start == end) {
    return 0;
  }
  slot = ranges->num_ranges;
  if (slot == 0) {
LAB_0012430b:
    slot = 0;
  }
  else {
    pqVar1 = ranges->ranges;
    end_slot = slot - 1;
    if (start <= pqVar1[end_slot].end) {
      if (end < pqVar1[end_slot].start) {
        pqVar3 = pqVar1 + (slot - 2);
        do {
          bVar6 = end_slot == 0;
          end_slot = end_slot - 1;
          if (bVar6) goto LAB_0012430b;
          puVar5 = &pqVar3->start;
          pqVar3 = pqVar3 + -1;
        } while (end < *puVar5);
      }
      puVar5 = &pqVar1[end_slot].end;
      sVar4 = 0xffffffffffffffff;
      do {
        if (*puVar5 == start) {
          if (start < ((quicly_range_t *)(puVar5 + -1))->start) {
            ((quicly_range_t *)(puVar5 + -1))->start = start;
          }
          if (end < pqVar1[end_slot].end) {
            end = pqVar1[end_slot].end;
          }
          *puVar5 = end;
          if (sVar4 == 0xffffffffffffffff) {
            return 0;
          }
          sVar4 = end_slot - sVar4;
          goto LAB_0012433f;
        }
        if (*puVar5 < start) {
          slot = end_slot - sVar4;
          if (sVar4 != 0xffffffffffffffff) {
            merge_update(ranges,start,end,slot,end_slot);
            return 0;
          }
          goto LAB_0012430d;
        }
        sVar4 = sVar4 + 1;
        puVar5 = puVar5 + -2;
      } while (end_slot != sVar4);
      if (start < pqVar1->start) {
        pqVar1->start = start;
      }
      if (end < pqVar1[end_slot].end) {
        end = pqVar1[end_slot].end;
      }
      pqVar1->end = end;
      if (end_slot == 0) {
        return 0;
      }
      sVar4 = 1;
LAB_0012433f:
      quicly_ranges_drop_by_range_indices(ranges,sVar4,end_slot + 1);
      return 0;
    }
  }
LAB_0012430d:
  iVar2 = insert_at(ranges,start,end,slot);
  return iVar2;
}

Assistant:

int quicly_ranges_add(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t slot, end_slot;

    assert(start <= end);

    if (start == end)
        return 0;

    if (ranges->num_ranges == 0) {
        return insert_at(ranges, start, end, 0);
    } else if (ranges->ranges[ranges->num_ranges - 1].end < start) {
        return insert_at(ranges, start, end, ranges->num_ranges);
    }

    /* find the slot that should contain `end` */
    for (slot = ranges->num_ranges - 1;; --slot) {
        if (ranges->ranges[slot].start <= end)
            break;
        if (slot == 0)
            return insert_at(ranges, start, end, 0);
    }
    end_slot = slot;

    /* find the slot that should contain `start` */
    do {
        if (ranges->ranges[slot].end == start) {
            return merge_update(ranges, start, end, slot, end_slot);
        } else if (ranges->ranges[slot].end < start) {
            if (slot++ == end_slot) {
                return insert_at(ranges, start, end, slot);
            } else {
                return merge_update(ranges, start, end, slot, end_slot);
            }
        }
    } while (slot-- != 0);

    return merge_update(ranges, start, end, 0, end_slot);
}